

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O0

void PrintOutput(N_Vector u)

{
  long *in_RDI;
  
  printf(" %8.6g  %8.6g\n",**(undefined8 **)(*in_RDI + 0x10),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 8));
  return;
}

Assistant:

static void PrintOutput(N_Vector u)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" %8.6Lg  %8.6Lg\n", Ith(u, 1), Ith(u, 2));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf(" %8.6g  %8.6g\n", Ith(u, 1), Ith(u, 2));
#else
  printf(" %8.6g  %8.6g\n", Ith(u, 1), Ith(u, 2));
#endif
}